

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.c
# Opt level: O2

int list_txt_files(char *dir_path,char ***file_names)

{
  size_t sVar1;
  int iVar2;
  DIR *__dirp;
  char **ppcVar3;
  dirent *pdVar4;
  char *pcVar5;
  size_t sz;
  
  __dirp = opendir(dir_path);
  if (__dirp == (DIR *)0x0) {
LAB_001170ff:
    *file_names = (char **)0x0;
  }
  else {
    ppcVar3 = (char **)malloc(8);
    *file_names = ppcVar3;
    if (ppcVar3 != (char **)0x0) {
      sVar1 = 0;
      do {
        do {
          sz = sVar1;
          pdVar4 = readdir(__dirp);
          if (pdVar4 == (dirent *)0x0) {
            closedir(__dirp);
            return (int)sz;
          }
          pcVar5 = strrchr(pdVar4->d_name,0x2e);
          sVar1 = sz;
        } while ((pcVar5 == (char *)0x0) || (iVar2 = strcmp(pcVar5,".txt"), iVar2 != 0));
        ppcVar3 = (char **)realloc(*file_names,sz * 8 + 8);
        if (ppcVar3 == (char **)0x0) {
          free_cstr_arr(*file_names,sz);
          goto LAB_001170ff;
        }
        *file_names = ppcVar3;
        pcVar5 = strdup(pdVar4->d_name);
        ppcVar3[sz] = pcVar5;
        sVar1 = (ulong)((int)sz + 1);
      } while (pcVar5 != (char *)0x0);
      free_cstr_arr(ppcVar3,sz);
      *file_names = (char **)0x0;
    }
    closedir(__dirp);
  }
  return -1;
}

Assistant:

int list_txt_files(const char *dir_path, char ***file_names) {
    #ifdef __unix__
        return __list_txt_files__unix(dir_path, file_names);
    #endif
    #ifdef _WIN32
        return __list_txt_files__win(dir_path, file_names);
    #endif
    return -1;
}